

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# music_xmi_midiout.cpp
# Opt level: O0

DWORD * __thiscall
XMISong::MakeEvents(XMISong *this,DWORD *events,DWORD *max_event_p,DWORD max_time)

{
  EventSource EVar1;
  DWORD *pDVar2;
  AutoNoteOff *pAVar3;
  bool bVar4;
  DWORD local_68;
  DWORD local_60;
  DWORD *new_events;
  DWORD DStack_40;
  bool sysex_noroom;
  DWORD delay;
  DWORD time;
  DWORD tot_time;
  DWORD *start_events;
  DWORD *pDStack_28;
  DWORD max_time_local;
  DWORD *max_event_p_local;
  DWORD *events_local;
  XMISong *this_local;
  
  delay = 0;
  _time = events;
  start_events._4_4_ = max_time;
  pDStack_28 = max_event_p;
  max_event_p_local = events;
  events_local = (DWORD *)this;
  while( true ) {
    DStack_40 = 0;
    bVar4 = false;
    if ((this->EventDue != EVENT_None) && (bVar4 = false, max_event_p_local < pDStack_28)) {
      bVar4 = delay <= start_events._4_4_;
    }
    if (!bVar4) break;
    do {
      if (this->EventDue == EVENT_Real) {
        local_60 = this->CurrSong->Delay;
      }
      else {
        pAVar3 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                           (&(this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>,0);
        local_60 = pAVar3->Delay;
      }
      new_events._4_4_ = local_60;
      DStack_40 = local_60 + DStack_40;
      delay = (local_60 * (this->super_MIDIStreamer).Tempo) /
              (uint)(this->super_MIDIStreamer).Division + delay;
      AdvanceSong(this,local_60);
      do {
        new_events._3_1_ = 0;
        pDVar2 = SendCommand(this,max_event_p_local,this->EventDue,DStack_40,
                             (long)pDStack_28 - (long)max_event_p_local >> 2,
                             (bool *)((long)&new_events + 3));
        if ((new_events._3_1_ & 1) != 0) {
          return max_event_p_local;
        }
        EVar1 = FindNextDue(this);
        this->EventDue = EVar1;
        if (pDVar2 != max_event_p_local) {
          DStack_40 = 0;
        }
        bVar4 = false;
        max_event_p_local = pDVar2;
        if (this->EventDue != EVENT_None) {
          if (this->EventDue == EVENT_Real) {
            local_68 = this->CurrSong->Delay;
          }
          else {
            pAVar3 = TArray<AutoNoteOff,_AutoNoteOff>::operator[]
                               (&(this->NoteOffs).super_TArray<AutoNoteOff,_AutoNoteOff>,0);
            local_68 = pAVar3->Delay;
          }
          bVar4 = false;
          if (local_68 == 0) {
            bVar4 = max_event_p_local < pDStack_28;
          }
        }
      } while (bVar4);
      bVar4 = false;
      if (_time == max_event_p_local) {
        bVar4 = this->EventDue != EVENT_None;
      }
    } while (bVar4);
  }
  return max_event_p_local;
}

Assistant:

DWORD *XMISong::MakeEvents(DWORD *events, DWORD *max_event_p, DWORD max_time)
{
	DWORD *start_events;
	DWORD tot_time = 0;
	DWORD time = 0;
	DWORD delay;

	start_events = events;
	while (EventDue != EVENT_None && events < max_event_p && tot_time <= max_time)
	{
		// It's possible that this tick may be nothing but meta-events and
		// not generate any real events. Repeat this until we actually
		// get some output so we don't send an empty buffer to the MIDI
		// device.
		do
		{
			delay = GET_DELAY;
			time += delay;
			// Advance time for all tracks by the amount needed for the one up next.
			tot_time += delay * Tempo / Division;
			AdvanceSong(delay);
			// Play all events for this tick.
			do
			{
				bool sysex_noroom = false;
				DWORD *new_events = SendCommand(events, EventDue, time, max_event_p - events, sysex_noroom);
				if (sysex_noroom)
				{
					return events;
				}
				EventDue = FindNextDue();
				if (new_events != events)
				{
					time = 0;
				}
				events = new_events;
			}
			while (EventDue != EVENT_None && GET_DELAY == 0 && events < max_event_p);
		}
		while (start_events == events && EventDue != EVENT_None);
		time = 0;
	}
	return events;
}